

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_scopy_to_ucol.c
# Opt level: O2

int ilu_scopy_to_ucol(int jcol,int nseg,int *segrep,int *repfnz,int *perm_r,float *dense,
                     int drop_rule,milu_t milu,double drop_tol,int quota,float *sum,int *nnzUj,
                     GlobalLU_t *Glu,float *work)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int jcol_00;
  int_t *piVar5;
  int_t iVar6;
  int iVar7;
  int_t *piVar8;
  long lVar9;
  long lVar10;
  int next;
  ulong uVar11;
  float *pfVar12;
  float fVar13;
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  int local_d8;
  int m;
  void *local_d0;
  int_t nzumax;
  float *local_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int i_1;
  int_t *local_a8;
  long local_a0;
  int *local_98;
  double local_90;
  undefined1 local_88 [8];
  undefined4 uStack_80;
  undefined4 uStack_7c;
  long local_70;
  ulong local_68;
  int_t *local_60;
  int *local_58;
  int *local_50;
  int *local_48;
  ulong local_40;
  int *local_38;
  
  local_c0 = dense;
  local_90 = drop_tol;
  local_50 = repfnz;
  local_48 = segrep;
  local_38 = perm_r;
  fVar13 = smach("Safe minimum");
  i_1 = 1;
  local_58 = Glu->xsup;
  local_98 = Glu->supno;
  piVar8 = Glu->lsub;
  local_60 = Glu->xlsub;
  local_d0 = Glu->ucol;
  pfVar12 = (float *)Glu->usub;
  local_a8 = Glu->xusub;
  nzumax = Glu->nzumax;
  *sum = 0.0;
  if (drop_rule == 0) {
    local_d8 = Glu->n;
    local_90 = -1.0;
  }
  else {
    local_d8 = quota;
  }
  local_70 = (long)jcol;
  local_b8 = local_98[local_70];
  next = local_a8[local_70];
  lVar9 = (long)nseg;
  uVar11 = 0;
  local_b4 = 0;
  if (0 < nseg) {
    local_b4 = nseg;
  }
  _local_88 = ZEXT416((uint)(1.0 / fVar13));
  local_b0 = jcol;
  do {
    lVar10 = local_70;
    piVar5 = local_a8;
    if ((int)uVar11 == local_b4) {
      local_a8[local_70 + 1] = next;
      iVar7 = local_a8[local_70];
      m = next - iVar7;
      if (((drop_rule & 0xeU) != 0) && (local_d8 < m)) {
        if (local_d8 < 1) {
        }
        else if (((uint)drop_rule >> 8 & 1) == 0) {
          local_c0 = pfVar12;
          scopy_(&m,(real *)((long)local_d0 + (long)iVar7 * 4),&i_1,work,&i_1);
          local_88._4_4_ = sqselect(m,work,local_d8);
          iVar7 = piVar5[lVar10];
          pfVar12 = local_c0;
        }
        else {
          auVar14 = divps(_DAT_00118640,_local_88);
          local_88._4_4_ =
               1.0 / (((float)local_d8 * (auVar14._0_4_ - auVar14._4_4_)) / (float)m + auVar14._4_4_
                     );
        }
        uVar11 = (ulong)(next - 1);
        lVar9 = (long)iVar7;
        do {
          uVar11 = (ulong)(int)uVar11;
          while( true ) {
            if ((long)uVar11 < lVar9) goto LAB_0010bcea;
            fVar13 = *(float *)((long)local_d0 + lVar9 * 4);
            fVar15 = ABS(fVar13);
            if ((float)local_88._4_4_ < fVar15) break;
            if ((milu - SMILU_1 < 2) || (fVar13 = fVar15, milu == SMILU_3)) {
              *sum = fVar13 + *sum;
            }
            *(undefined4 *)((long)local_d0 + lVar9 * 4) =
                 *(undefined4 *)((long)local_d0 + uVar11 * 4);
            ((int_t *)pfVar12)[lVar9] = ((int_t *)pfVar12)[uVar11];
            m = m + -1;
            uVar11 = uVar11 - 1;
            piVar1 = piVar5 + lVar10 + 1;
            *piVar1 = *piVar1 + -1;
          }
          lVar9 = lVar9 + 1;
        } while( true );
      }
LAB_0010bcea:
      if (milu == SMILU_2) {
        *sum = ABS(*sum);
      }
      *nnzUj = *nnzUj + m;
      return 0;
    }
    lVar9 = lVar9 + -1;
    iVar7 = local_48[lVar9];
    local_40 = uVar11;
    if ((local_98[iVar7] != local_b8) && (iVar2 = local_50[iVar7], local_a0 = lVar9, iVar2 != -1)) {
      iVar3 = local_58[local_98[iVar7]];
      local_68 = (ulong)(uint)(iVar7 - iVar2);
      iVar4 = local_60[iVar3];
      while (jcol_00 = local_b0, nzumax < next + (iVar7 - iVar2) + 1) {
        iVar6 = sLUMemXpand(local_b0,next,UCOL,&nzumax,Glu);
        if (iVar6 != 0) {
          return iVar6;
        }
        local_d0 = Glu->ucol;
        iVar6 = sLUMemXpand(jcol_00,next,USUB,&nzumax,Glu);
        if (iVar6 != 0) {
          return iVar6;
        }
        piVar8 = Glu->lsub;
        pfVar12 = (float *)Glu->usub;
      }
      for (lVar10 = 0; lVar9 = local_a0, (int)lVar10 <= (int)local_68; lVar10 = lVar10 + 1) {
        iVar7 = piVar8[((iVar2 - iVar3) + iVar4) + lVar10];
        fVar13 = local_c0[iVar7];
        fVar15 = ABS(fVar13);
        if ((local_d8 < 1) || ((double)fVar15 < local_90)) {
          if (milu - SMILU_1 < 2) {
            fVar13 = fVar13 + *sum;
          }
          else {
            if (milu != SMILU_3) goto LAB_0010bb82;
            fVar13 = *sum + fVar15;
          }
          *sum = fVar13;
        }
        else {
          auVar16._0_4_ = ~-(uint)(fVar15 < (float)local_88._0_4_) & local_88._0_4_;
          auVar16._4_4_ = ~-(uint)((float)local_88._4_4_ < fVar15) & local_88._4_4_;
          auVar16._8_4_ = uStack_80;
          auVar16._12_4_ = uStack_7c;
          auVar14._4_4_ = (uint)fVar15 & -(uint)((float)local_88._4_4_ < fVar15);
          auVar14._0_4_ = (uint)fVar15 & -(uint)(fVar15 < (float)local_88._0_4_);
          auVar14._8_8_ = 0;
          _local_88 = auVar16 | auVar14;
          ((int_t *)pfVar12)[next] = local_38[iVar7];
          *(float *)((long)local_d0 + (long)next * 4) = fVar13;
          next = next + 1;
        }
LAB_0010bb82:
        local_c0[iVar7] = 0.0;
      }
    }
    uVar11 = (ulong)((int)local_40 + 1);
  } while( true );
}

Assistant:

int
ilu_scopy_to_ucol(
	      int	 jcol,	   /* in */
	      int	 nseg,	   /* in */
	      int	 *segrep,  /* in */
	      int	 *repfnz,  /* in */
	      int	 *perm_r,  /* in */
	      float	 *dense,   /* modified - reset to zero on return */
	      int  	 drop_rule,/* in */
	      milu_t	 milu,	   /* in */
	      double	 drop_tol, /* in */
	      int	 quota,    /* maximum nonzero entries allowed */
	      float	 *sum,	   /* out - the sum of dropped entries */
	      int	 *nnzUj,   /* in - out */
	      GlobalLU_t *Glu,	   /* modified */
	      float	 *work	   /* working space with minimum size n,
				    * used by the second dropping rule */
	      )
{
/*
 * Gather from SPA dense[*] to global ucol[*].
 */
    int       ksub, krep, ksupno, kfnz, segsze;
    int       i, k; 
    int       fsupc, isub, irow;
    int       jsupno;
    int_t     new_next, nextu, mem_error;
    int       *xsup, *supno;
    int_t     *lsub, *xlsub;
    float    *ucol;
    int_t     *usub, *xusub;
    int_t     nzumax;
    int       m; /* number of entries in the nonzero U-segments */
    register float d_max = 0.0, d_min = 1.0 / smach("Safe minimum");
    register double tmp;
    float zero = 0.0;
    int i_1 = 1;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    ucol    = (float *) Glu->ucol;
    usub    = Glu->usub;
    xusub   = Glu->xusub;
    nzumax  = Glu->nzumax;

    *sum = zero;
    if (drop_rule == NODROP) {
	drop_tol = -1.0, quota = Glu->n;
    }

    jsupno = supno[jcol];
    nextu  = xusub[jcol];
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {
	krep = segrep[k--];
	ksupno = supno[krep];

	if ( ksupno != jsupno ) { /* Should go into ucol[] */
	    kfnz = repfnz[krep];
	    if ( kfnz != SLU_EMPTY ) {	/* Nonzero U-segment */

		fsupc = xsup[ksupno];
		isub = xlsub[fsupc] + kfnz - fsupc;
		segsze = krep - kfnz + 1;

		new_next = nextu + segsze;
		while ( new_next > nzumax ) {
		    if ((mem_error = sLUMemXpand(jcol, nextu, UCOL, &nzumax,
			    Glu)) != 0)
			return (mem_error);
		    ucol = Glu->ucol;
		    if ((mem_error = sLUMemXpand(jcol, nextu, USUB, &nzumax,
			    Glu)) != 0)
			return (mem_error);
		    usub = Glu->usub;
		    lsub = Glu->lsub;
		}

		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub++];
		    tmp = fabs(dense[irow]);

		    /* first dropping rule */
		    if (quota > 0 && tmp >= drop_tol) {
			if (tmp > d_max) d_max = tmp;
			if (tmp < d_min) d_min = tmp;
			usub[nextu] = perm_r[irow];
			ucol[nextu] = dense[irow];
			nextu++;
		    } else {
			switch (milu) {
			    case SMILU_1:
			    case SMILU_2:
				*sum += dense[irow];
				break;
			    case SMILU_3:
				/* *sum += fabs(dense[irow]);*/
				*sum += tmp;
				break;
			    case SILU:
			    default:
				break;
			}
#ifdef DEBUG
			num_drop_U++;
#endif
		    }
		    dense[irow] = zero;
		}

	    }

	}

    } /* for each segment... */

    xusub[jcol + 1] = nextu;	  /* Close U[*,jcol] */
    m = xusub[jcol + 1] - xusub[jcol];

    /* second dropping rule */
    if (drop_rule & DROP_SECONDARY && m > quota) {
	register double tol = d_max;
	register int m0 = xusub[jcol] + m - 1;

	if (quota > 0) {
	    if (drop_rule & DROP_INTERP) {
		d_max = 1.0 / d_max; d_min = 1.0 / d_min;
		tol = 1.0 / (d_max + (d_min - d_max) * quota / m);
	    } else {
		scopy_(&m, &ucol[xusub[jcol]], &i_1, work, &i_1);
		tol = sqselect(m, work, quota);
#if 0
		A = &ucol[xusub[jcol]];
		for (i = 0; i < m; i++) work[i] = i;
		qsort(work, m, sizeof(int), _compare_);
		tol = fabs(usub[xusub[jcol] + work[quota]]);
#endif
	    }
	}
	for (i = xusub[jcol]; i <= m0; ) {
	    if (fabs(ucol[i]) <= tol) {
		switch (milu) {
		    case SMILU_1:
		    case SMILU_2:
			*sum += ucol[i];
			break;
		    case SMILU_3:
			*sum += fabs(ucol[i]);
			break;
		    case SILU:
		    default:
			break;
		}
		ucol[i] = ucol[m0];
		usub[i] = usub[m0];
		m0--;
		m--;
#ifdef DEBUG
		num_drop_U++;
#endif
		xusub[jcol + 1]--;
		continue;
	    }
	    i++;
	}
    }

    if (milu == SMILU_2) *sum = fabs(*sum);

    *nnzUj += m;

    return 0;
}